

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
higan::TcpServer::TcpServer(TcpServer *this,EventLoop *loop,InetAddress *addr,string *server_name)

{
  TcpServer *local_a8;
  code *local_a0;
  undefined8 local_98;
  type local_90;
  NewConnectionCallback local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *server_name_local;
  InetAddress *addr_local;
  EventLoop *loop_local;
  TcpServer *this_local;
  
  this->loop_ = loop;
  local_28 = server_name;
  server_name_local = &addr->ip_;
  addr_local = (InetAddress *)loop;
  loop_local = (EventLoop *)this;
  std::operator+(&local_48,server_name,"Pool");
  EventLoopThreadPool::EventLoopThreadPool(&this->thread_pool_,&local_48,(EventLoop *)addr_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&this->server_name_,(string *)local_28);
  InetAddress::InetAddress(&this->server_addr_,(InetAddress *)server_name_local);
  Acceptor::Acceptor(&this->acceptor_,this->loop_,(InetAddress *)server_name_local);
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<int,_std::shared_ptr<higan::TcpConnection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>_>
  ::map(&this->connection_map_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::function
            (&this->message_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::function
            (&this->newconnection_callback_);
  local_a0 = OnNewConnection;
  local_98 = 0;
  local_a8 = this;
  std::
  bind<void(higan::TcpServer::*)(int,higan::InetAddress_const&),higan::TcpServer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_90,(offset_in_TcpServer_to_subr *)&local_a0,&local_a8,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(int,higan::InetAddress_const&)>::
  function<std::_Bind<void(higan::TcpServer::*(higan::TcpServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,higan::InetAddress_const&)>,void>
            ((function<void(int,higan::InetAddress_const&)> *)&local_78,&local_90);
  Acceptor::SetNewConnectionCallback(&this->acceptor_,&local_78);
  std::function<void_(int,_const_higan::InetAddress_&)>::~function(&local_78);
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop* loop, const InetAddress& addr, const std::string& server_name):
		loop_(loop),
		thread_pool_(server_name + "Pool", loop),
		server_name_(server_name),
		server_addr_(addr),
		acceptor_(loop_, addr),
		connection_map_()
{
	acceptor_.SetNewConnectionCallback(std::bind(&TcpServer::OnNewConnection,
			this, _1, _2));
}